

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

InterfaceSchema __thiscall capnp::Type::asInterface(Type *this)

{
  bool bVar1;
  Schema local_40;
  Fault local_38;
  Fault f_1;
  Fault local_20;
  Fault f;
  Type *this_local;
  
  f.exception = (Exception *)this;
  bVar1 = isInterface(this);
  if (bVar1) {
    if ((this->field_4).schema == (RawBrandedSchema *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x323,FAILED,"schema != nullptr","");
      kj::_::Debug::Fault::fatal(&local_38);
    }
    Schema::Schema(&local_40,(this->field_4).schema);
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local,local_40);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,800,FAILED,"isInterface()",
               "\"Tried to interpret a non-interface type as an interface.\"",
               (char (*) [57])"Tried to interpret a non-interface type as an interface.");
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return (InterfaceSchema)(Schema)this_local;
}

Assistant:

InterfaceSchema Type::asInterface() const {
  KJ_REQUIRE(isInterface(), "Tried to interpret a non-interface type as an interface.") {
    return InterfaceSchema();
  }
  KJ_ASSERT(schema != nullptr);
  return InterfaceSchema(Schema(schema));
}